

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O0

void __thiscall fasttext::Dictionary::dump(Dictionary *this,ostream *out)

{
  bool bVar1;
  size_type sVar2;
  void *this_00;
  reference peVar3;
  ostream *poVar4;
  ostream *in_RSI;
  long in_RDI;
  entry *it;
  const_iterator __end1;
  const_iterator __begin1;
  vector<fasttext::entry,_std::allocator<fasttext::entry>_> *__range1;
  vector<fasttext::entry,_std::allocator<fasttext::entry>_> *in_stack_ffffffffffffffb8;
  __normal_iterator<const_fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
  local_20;
  long local_18;
  ostream *local_10;
  
  local_10 = in_RSI;
  sVar2 = std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::size
                    ((vector<fasttext::entry,_std::allocator<fasttext::entry>_> *)(in_RDI + 0x28));
  this_00 = (void *)std::ostream::operator<<(in_RSI,sVar2);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  local_18 = in_RDI + 0x28;
  local_20._M_current =
       (entry *)std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::begin
                          (in_stack_ffffffffffffffb8);
  std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::end(in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
                        *)in_RSI,
                       (__normal_iterator<const_fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
                        *)in_stack_ffffffffffffffb8);
    if (!bVar1) break;
    peVar3 = __gnu_cxx::
             __normal_iterator<const_fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
             ::operator*(&local_20);
    if (peVar3->type == label) {
      poVar4 = std::operator<<(local_10,(string *)peVar3);
      poVar4 = std::operator<<(poVar4," ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,peVar3->count);
      poVar4 = std::operator<<(poVar4," ");
      poVar4 = std::operator<<(poVar4,"label");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar4 = std::operator<<(local_10,(string *)peVar3);
      poVar4 = std::operator<<(poVar4," ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,peVar3->count);
      poVar4 = std::operator<<(poVar4," ");
      poVar4 = std::operator<<(poVar4,"word");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    __gnu_cxx::
    __normal_iterator<const_fasttext::entry_*,_std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>_>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

void Dictionary::dump(std::ostream& out) const {
  out << words_.size() << std::endl;
  for (const auto& it : words_) {
    if (it.type == entry_type::label) {
        out << it.word << " " << it.count << " " << "label" << std::endl;
    } else {
        out << it.word << " " << it.count << " " << "word" << std::endl;
    }
  }
}